

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::GetRuleLauncher
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,
          string *prop,string *config)

{
  cmValue config_00;
  bool bVar1;
  string *psVar2;
  allocator<char> local_8d [13];
  string local_80;
  string local_60;
  string *local_40;
  cmValue local_38;
  cmValue value;
  string *config_local;
  string *prop_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *this_local;
  
  value.Value = config;
  local_38 = cmMakefile::GetProperty(this->Makefile,prop);
  if (target != (cmGeneratorTarget *)0x0) {
    local_40 = (string *)cmGeneratorTarget::GetProperty(target,prop);
    local_38 = (cmValue)local_40;
  }
  bVar1 = cmValue::operator_cast_to_bool(&local_38);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_38);
    std::__cxx11::string::string((string *)&local_60,(string *)psVar2);
    config_00 = value;
    std::__cxx11::string::string((string *)&local_80);
    cmGeneratorExpression::Evaluate
              (__return_storage_ptr__,&local_60,this,config_00.Value,target,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_8d)
    ;
    std::allocator<char>::~allocator(local_8d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetRuleLauncher(cmGeneratorTarget* target,
                                              const std::string& prop,
                                              const std::string& config)
{
  cmValue value = this->Makefile->GetProperty(prop);
  if (target) {
    value = target->GetProperty(prop);
  }
  if (value) {
    return cmGeneratorExpression::Evaluate(*value, this, config, target);
  }
  return "";
}